

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall
BuildWithDepsLogTestDepFileOKDepsLog::Run(BuildWithDepsLogTestDepFileOKDepsLog *this)

{
  VirtualFileSystem *this_00;
  BuildConfig *config;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  long lVar3;
  Edge *this_01;
  Test *pTVar4;
  unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_> uVar5;
  bool bVar6;
  bool bVar7;
  LoadStatus LVar8;
  Node *pNVar9;
  unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_> uVar10;
  StringPiece path;
  allocator<char> local_2d2;
  allocator<char> local_2d1;
  string local_2d0;
  string err;
  DepsLog deps_log;
  string local_230;
  Builder builder;
  State state;
  
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&state,"foo.c",(allocator<char> *)&deps_log);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&builder,"",(allocator<char> *)&local_2d0);
  this_00 = &(this->super_BuildWithDepsLogTest).super_BuildTest.fs_;
  VirtualFileSystem::Create(this_00,(string *)&state,(string *)&builder);
  std::__cxx11::string::~string((string *)&builder);
  std::__cxx11::string::~string((string *)&state);
  State::State(&state);
  iVar2 = g_current_test->assertion_failures_;
  AssertParse(&state,
              "rule cc\n  command = cc $in\n  depfile = $out.d\n  deps = gcc\nbuild fo$ o.o: cc foo.c\n"
              ,(ManifestParserOptions)0x0);
  pTVar4 = g_current_test;
  if (iVar2 == g_current_test->assertion_failures_) {
    paVar1 = &deps_log.file_path_.field_2;
    deps_log.needs_recompaction_ = false;
    deps_log.file_ = (FILE *)0x0;
    deps_log.file_path_._M_string_length = 0;
    deps_log.file_path_.field_2._M_local_buf[0] = '\0';
    deps_log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    deps_log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    deps_log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    deps_log.file_path_._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&builder,"ninja_deps",(allocator<char> *)&local_2d0);
    bVar6 = DepsLog::OpenForWrite(&deps_log,(string *)&builder,&err);
    bVar6 = testing::Test::Check
                      (pTVar4,bVar6,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0x946,"deps_log.OpenForWrite(\"ninja_deps\", &err)");
    std::__cxx11::string::~string((string *)&builder);
    pTVar4 = g_current_test;
    if (bVar6) {
      bVar6 = std::operator==("",&err);
      bVar6 = testing::Test::Check
                        (pTVar4,bVar6,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                         ,0x947,"\"\" == err");
      if (!bVar6) goto LAB_0012d992;
      config = &(this->super_BuildWithDepsLogTest).super_BuildTest.config_;
      Builder::Builder(&builder,&state,config,(BuildLog *)0x0,&deps_log,
                       &this_00->super_DiskInterface);
      uVar10._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
      super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
      super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
           (__uniq_ptr_data<CommandRunner,_std::default_delete<CommandRunner>,_true,_true>)
           &(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_;
      uVar5._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
      super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
      super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
           uVar10._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>.
           _M_t.super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
           super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
      if ((__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)
          builder.command_runner_._M_t.
          super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
          super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
          super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)0x0) {
        lVar3 = *(long *)builder.command_runner_._M_t.
                         super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>
                         .super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
        builder.command_runner_._M_t.
        super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
        super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
        super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
             uVar10._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>.
             _M_t.super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
             super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
        (**(code **)(lVar3 + 8))();
        uVar5._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
        super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
        super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
             builder.command_runner_._M_t.
             super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
             super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
             super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
      }
      builder.command_runner_._M_t.
      super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
      super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
      super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
           uVar5._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t
           .super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
           super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
      pTVar4 = g_current_test;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2d0,"fo o.o",(allocator<char> *)&local_230);
      pNVar9 = Builder::AddTarget(&builder,&local_2d0,&err);
      testing::Test::Check
                (pTVar4,pNVar9 != (Node *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0x94b,"builder.AddTarget(\"fo o.o\", &err)");
      std::__cxx11::string::~string((string *)&local_2d0);
      pTVar4 = g_current_test;
      bVar6 = std::operator==("",&err);
      bVar6 = testing::Test::Check
                        (pTVar4,bVar6,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                         ,0x94c,"\"\" == err");
      if (bVar6) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2d0,"fo o.o.d",&local_2d1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_230,"fo\\ o.o: blah.h bar.h\n",&local_2d2);
        VirtualFileSystem::Create(this_00,&local_2d0,&local_230);
        std::__cxx11::string::~string((string *)&local_230);
        std::__cxx11::string::~string((string *)&local_2d0);
        pTVar4 = g_current_test;
        bVar7 = Builder::Build(&builder,&err);
        testing::Test::Check
                  (pTVar4,bVar7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                   ,0x94e,"builder.Build(&err)");
        pTVar4 = g_current_test;
        bVar7 = std::operator==("",&err);
        testing::Test::Check
                  (pTVar4,bVar7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                   ,0x94f,"\"\" == err");
        DepsLog::Close(&deps_log);
        builder.command_runner_._M_t.
        super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
        super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
        super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
             (__uniq_ptr_data<CommandRunner,_std::default_delete<CommandRunner>,_true,_true>)
             (__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)0x0;
      }
      else {
        g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
      }
      Builder::~Builder(&builder);
      DepsLog::~DepsLog(&deps_log);
      State::~State(&state);
      if (!bVar6) goto LAB_0012d9ad;
      State::State(&state);
      iVar2 = g_current_test->assertion_failures_;
      AssertParse(&state,
                  "rule cc\n  command = cc $in\n  depfile = $out.d\n  deps = gcc\nbuild fo$ o.o: cc foo.c\n"
                  ,(ManifestParserOptions)0x0);
      pTVar4 = g_current_test;
      if (iVar2 != g_current_test->assertion_failures_) {
        g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
        goto LAB_0012d9a0;
      }
      deps_log.needs_recompaction_ = false;
      deps_log.file_ = (FILE *)0x0;
      deps_log.file_path_._M_string_length = 0;
      deps_log.file_path_.field_2._M_local_buf[0] = '\0';
      deps_log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      deps_log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      deps_log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      deps_log.file_path_._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&builder,"ninja_deps",(allocator<char> *)&local_2d0);
      LVar8 = DepsLog::Load(&deps_log,(string *)&builder,&state,&err);
      bVar6 = testing::Test::Check
                        (pTVar4,LVar8 != LOAD_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                         ,0x95a,"deps_log.Load(\"ninja_deps\", &state, &err)");
      std::__cxx11::string::~string((string *)&builder);
      pTVar4 = g_current_test;
      if (bVar6) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&builder,"ninja_deps",(allocator<char> *)&local_2d0);
        bVar6 = DepsLog::OpenForWrite(&deps_log,(string *)&builder,&err);
        bVar6 = testing::Test::Check
                          (pTVar4,bVar6,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                           ,0x95b,"deps_log.OpenForWrite(\"ninja_deps\", &err)");
        std::__cxx11::string::~string((string *)&builder);
        pTVar4 = g_current_test;
        if (!bVar6) goto LAB_0012dd79;
        bVar6 = std::operator==("",&err);
        bVar6 = testing::Test::Check
                          (pTVar4,bVar6,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                           ,0x95c,"\"\" == err");
        if (bVar6) {
          Builder::Builder(&builder,&state,config,(BuildLog *)0x0,&deps_log,
                           &this_00->super_DiskInterface);
          if ((__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)
              builder.command_runner_._M_t.
              super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
              super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
              super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)0x0) {
            lVar3 = *(long *)builder.command_runner_._M_t.
                             super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>
                             .super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
            builder.command_runner_._M_t.
            super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
            super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
            super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
                 uVar10._M_t.
                 super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
                 super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                 super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
            (**(code **)(lVar3 + 8))();
            uVar10._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>.
            _M_t.super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
            super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
                 builder.command_runner_._M_t.
                 super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
                 super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                 super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
          }
          builder.command_runner_._M_t.
          super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
          super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
          super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
               uVar10._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>
               ._M_t.super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
               super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
          this_01 = state.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1];
          path.len_ = 5;
          path.str_ = "bar.h";
          pNVar9 = State::GetNode(&state,path,0);
          pNVar9->dirty_ = true;
          pTVar4 = g_current_test;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2d0,"fo o.o",(allocator<char> *)&local_230);
          pNVar9 = Builder::AddTarget(&builder,&local_2d0,&err);
          testing::Test::Check
                    (pTVar4,pNVar9 != (Node *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                     ,0x964,"builder.AddTarget(\"fo o.o\", &err)");
          std::__cxx11::string::~string((string *)&local_2d0);
          pTVar4 = g_current_test;
          bVar6 = std::operator==("",&err);
          bVar6 = testing::Test::Check
                            (pTVar4,bVar6,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                             ,0x965,"\"\" == err");
          if ((bVar6) &&
             (bVar6 = testing::Test::Check
                                (g_current_test,
                                 (long)state.edges_.
                                       super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                 (long)state.edges_.
                                       super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                                       super__Vector_impl_data._M_start == 0x18,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                                 ,0x969,"3u == state.edges_.size()"), bVar6)) {
            bVar6 = testing::Test::Check
                              (g_current_test,
                               (long)(this_01->inputs_).
                                     super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                               (long)(this_01->inputs_).
                                     super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                     super__Vector_impl_data._M_start == 0x18,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                               ,0x96b,"3u == edge->inputs_.size()");
            pTVar4 = g_current_test;
            if (bVar6) {
              Edge::EvaluateCommand_abi_cxx11_(&local_2d0,this_01,false);
              bVar6 = std::operator==("cc foo.c",&local_2d0);
              bVar6 = testing::Test::Check
                                (pTVar4,bVar6,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                                 ,0x96e,"\"cc foo.c\" == edge->EvaluateCommand()");
              std::__cxx11::string::~string((string *)&local_2d0);
              if (bVar6) {
                DepsLog::Close(&deps_log);
                builder.command_runner_._M_t.
                super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
                super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
                     (__uniq_ptr_data<CommandRunner,_std::default_delete<CommandRunner>,_true,_true>
                     )(__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)0x0;
              }
              else {
                g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
              }
            }
            else {
              g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
            }
          }
          else {
            g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
          }
          Builder::~Builder(&builder);
        }
        else {
          g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
        }
      }
      else {
LAB_0012dd79:
        g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
      }
    }
    else {
LAB_0012d992:
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
    DepsLog::~DepsLog(&deps_log);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
LAB_0012d9a0:
  State::~State(&state);
LAB_0012d9ad:
  std::__cxx11::string::~string((string *)&err);
  return;
}

Assistant:

TEST_F(BuildWithDepsLogTest, DepFileOKDepsLog) {
  string err;
  const char* manifest =
      "rule cc\n  command = cc $in\n  depfile = $out.d\n  deps = gcc\n"
      "build fo$ o.o: cc foo.c\n";

  fs_.Create("foo.c", "");

  {
    State state;
    ASSERT_NO_FATAL_FAILURE(AssertParse(&state, manifest));

    // Run the build once, everything should be ok.
    DepsLog deps_log;
    ASSERT_TRUE(deps_log.OpenForWrite("ninja_deps", &err));
    ASSERT_EQ("", err);

    Builder builder(&state, config_, NULL, &deps_log, &fs_);
    builder.command_runner_.reset(&command_runner_);
    EXPECT_TRUE(builder.AddTarget("fo o.o", &err));
    ASSERT_EQ("", err);
    fs_.Create("fo o.o.d", "fo\\ o.o: blah.h bar.h\n");
    EXPECT_TRUE(builder.Build(&err));
    EXPECT_EQ("", err);

    deps_log.Close();
    builder.command_runner_.release();
  }

  {
    State state;
    ASSERT_NO_FATAL_FAILURE(AssertParse(&state, manifest));

    DepsLog deps_log;
    ASSERT_TRUE(deps_log.Load("ninja_deps", &state, &err));
    ASSERT_TRUE(deps_log.OpenForWrite("ninja_deps", &err));
    ASSERT_EQ("", err);

    Builder builder(&state, config_, NULL, &deps_log, &fs_);
    builder.command_runner_.reset(&command_runner_);

    Edge* edge = state.edges_.back();

    state.GetNode("bar.h", 0)->MarkDirty();  // Mark bar.h as missing.
    EXPECT_TRUE(builder.AddTarget("fo o.o", &err));
    ASSERT_EQ("", err);

    // Expect three new edges: one generating fo o.o, and two more from
    // loading the depfile.
    ASSERT_EQ(3u, state.edges_.size());
    // Expect our edge to now have three inputs: foo.c and two headers.
    ASSERT_EQ(3u, edge->inputs_.size());

    // Expect the command line we generate to only use the original input.
    ASSERT_EQ("cc foo.c", edge->EvaluateCommand());

    deps_log.Close();
    builder.command_runner_.release();
  }
}